

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  Expr **ppWhere;
  undefined1 *puVar2;
  u8 uVar3;
  i16 iVar4;
  Parse *pParse;
  sqlite3 *db;
  SrcList *pList;
  ExprList *pList_00;
  Parse *pParse_00;
  sqlite3 *db_00;
  ExprList *zFormat;
  With *pWVar5;
  With *pWVar6;
  With *pWVar7;
  SrcList *pSVar8;
  Column *pCVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Table *pTVar14;
  Select *pSVar15;
  Table **ppTVar16;
  ulong uVar17;
  ulong uVar18;
  Expr *pEVar19;
  Expr *pEVar20;
  size_t sVar21;
  char *p_00;
  char *pcVar22;
  uint uVar23;
  uint iColLeft;
  ulong uVar24;
  With *pWVar25;
  Select *pSVar26;
  SrcList_item *pSVar27;
  long lVar28;
  ExprList_item *pEVar29;
  char *pcVar30;
  int i_1;
  uint iLeft;
  Select *pSVar31;
  long lVar32;
  Table **ppTVar33;
  byte *pbVar34;
  long lVar35;
  With *pWVar36;
  Schema **ppSVar37;
  int i;
  With *p_1;
  SrcList *pSVar38;
  bool bVar39;
  bool bVar40;
  long local_e8;
  With *local_e0;
  Parse *local_c8;
  With *local_b8;
  sqlite3 *local_98;
  char *local_88;
  long local_80;
  With *local_60;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar23 = p->selFlags;
  p->selFlags = uVar23 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pList = p->pSrc;
  if ((uVar23 & 0x40) != 0 || pList == (SrcList *)0x0) {
    return 1;
  }
  pList_00 = p->pEList;
  pWVar25 = p->pWith;
  if (pWVar25 != (With *)0x0) {
    pWVar25->pOuter = pParse->pWith;
    pParse->pWith = pWVar25;
  }
  sqlite3SrcListAssignCursors(pParse,pList);
  if (0 < pList->nSrc) {
    iVar11 = 0;
    pSVar27 = pList->a;
    do {
      bVar10 = (pSVar27->fg).field_0x1;
      uVar23 = 0;
      if ((bVar10 & 0x20) == 0) {
        pParse_00 = pWalker->pParse;
        db_00 = pParse_00->db;
        if (pSVar27->zDatabase == (char *)0x0) {
          pcVar30 = pSVar27->zName;
          if (pcVar30 == (char *)0x0) {
            pWVar25 = (With *)0x0;
          }
          else {
            pWVar25 = pParse_00->pWith;
            bVar40 = pWVar25 == (With *)0x0;
            local_98 = db_00;
            if (bVar40) {
              pWVar25 = (With *)0x0;
              local_c8 = pParse_00;
            }
            else {
              do {
                uVar17 = (ulong)pWVar25->nCte;
                bVar39 = 0 < (long)uVar17;
                if (0 < (long)uVar17) {
                  iVar12 = sqlite3StrICmp(pcVar30,pWVar25->a[0].zName);
                  if (iVar12 == 0) {
                    local_e0 = (With *)pWVar25->a;
                    bVar39 = true;
                    local_b8 = pWVar25;
                  }
                  else {
                    uVar18 = 1;
                    pWVar5 = pWVar25 + 1;
                    do {
                      pWVar36 = pWVar5;
                      uVar24 = uVar18;
                      pWVar6 = local_e0;
                      pWVar7 = local_b8;
                      if (uVar17 == uVar24) break;
                      iVar12 = sqlite3StrICmp(pcVar30,*(char **)pWVar36);
                      uVar18 = uVar24 + 1;
                      pWVar5 = (With *)&pWVar36->a[0].pSelect;
                      pWVar6 = pWVar36;
                      pWVar7 = pWVar25;
                    } while (iVar12 != 0);
                    local_b8 = pWVar7;
                    local_e0 = pWVar6;
                    bVar39 = uVar24 < uVar17;
                  }
                }
                if (bVar39) break;
                pWVar25 = pWVar25->pOuter;
                bVar40 = pWVar25 == (With *)0x0;
              } while (!bVar40);
              pWVar25 = local_e0;
              local_c8 = pParse_00;
              if (bVar40) {
                pWVar25 = (With *)0x0;
              }
            }
          }
        }
        else {
          pWVar25 = (With *)0x0;
        }
        if (pWVar25 == (With *)0x0) {
LAB_0023bf85:
          if (pSVar27->pTab == (Table *)0x0) {
            if (pSVar27->zName != (char *)0x0) {
              pTVar14 = sqlite3LocateTableItem(pParse,0,pSVar27);
              pSVar27->pTab = pTVar14;
              uVar23 = 1;
              if (pTVar14 != (Table *)0x0) {
                if (pTVar14->nTabRef < 0xffff) {
                  pTVar14->nTabRef = pTVar14->nTabRef + 1;
                  if ((pTVar14->nModuleArg != 0) || (((pSVar27->fg).field_0x1 & 4) == 0)) {
                    if ((pTVar14->nModuleArg != 0) || (pTVar14->pSelect != (Select *)0x0)) {
                      iVar12 = sqlite3ViewGetColumnNames(pParse,pTVar14);
                      if (iVar12 != 0) goto LAB_0023bffd;
                      pSVar15 = sqlite3SelectDup(db,pTVar14->pSelect,0);
                      pSVar27->pSelect = pSVar15;
                      iVar4 = pTVar14->nCol;
                      pTVar14->nCol = -1;
                      sqlite3WalkSelect(pWalker,pSVar15);
                      pTVar14->nCol = iVar4;
                    }
                    goto LAB_0023bf8c;
                  }
                  sqlite3ErrorMsg(pParse,"\'%s\' is not a function",pSVar27->zName);
                }
                else {
                  sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar14->zName);
                  pSVar27->pTab = (Table *)0x0;
                }
              }
              goto LAB_0023bff9;
            }
            pSVar15 = pSVar27->pSelect;
            iVar12 = sqlite3WalkSelect(pWalker,pSVar15);
            uVar23 = 1;
            if (iVar12 == 0) {
              pTVar14 = (Table *)sqlite3DbMallocZero(db,0x80);
              pSVar27->pTab = pTVar14;
              if (pTVar14 != (Table *)0x0) {
                pTVar14->nTabRef = 1;
                pcVar30 = sqlite3MPrintf(db,"sqlite_sq_%p",pTVar14);
                pTVar14->zName = pcVar30;
                do {
                  pSVar31 = pSVar15;
                  pSVar15 = pSVar31->pPrior;
                } while (pSVar15 != (Select *)0x0);
                sqlite3ColumnsFromExprList(pParse,pSVar31->pEList,&pTVar14->nCol,&pTVar14->aCol);
                pTVar14->iPKey = -1;
                pTVar14->nRowLogEst = 200;
                *(byte *)&pTVar14->tabFlags = (byte)pTVar14->tabFlags | 2;
                goto LAB_0023bf8c;
              }
            }
          }
          else {
LAB_0023bf8c:
            uVar23 = sqlite3IndexedByLookup(pParse,pSVar27);
          }
        }
        else {
          zFormat = pWVar25->a[0].pCols;
          if (zFormat == (ExprList *)0x0) {
            if ((bVar10 & 4) == 0) {
              pTVar14 = (Table *)sqlite3DbMallocZero(db_00,0x80);
              pSVar27->pTab = pTVar14;
              uVar23 = 1;
              local_e0 = pWVar25;
              local_c8 = pParse_00;
              if (pTVar14 != (Table *)0x0) {
                pTVar14->nTabRef = 1;
                pcVar30 = sqlite3DbStrDup(db_00,*(char **)pWVar25);
                pTVar14->zName = pcVar30;
                pTVar14->iPKey = -1;
                pTVar14->nRowLogEst = 200;
                *(byte *)&pTVar14->tabFlags = (byte)pTVar14->tabFlags | 0x42;
                pSVar15 = sqlite3SelectDup(db_00,(Select *)pWVar25->a[0].zName,0);
                pSVar27->pSelect = pSVar15;
                if (db_00->mallocFailed == '\0') {
                  bVar10 = pSVar15->op + 0x8d;
                  local_98 = (sqlite3 *)CONCAT71(local_98._1_7_,bVar10);
                  if ((bVar10 < 2) && (pSVar8 = pSVar15->pSrc, 0 < pSVar8->nSrc)) {
                    pbVar34 = &pSVar8->a[0].fg.field_0x1;
                    lVar28 = 0;
                    do {
                      if (((*(long *)(pbVar34 + -0x35) == 0) &&
                          (*(char **)(pbVar34 + -0x2d) != (char *)0x0)) &&
                         (iVar12 = sqlite3StrICmp(*(char **)(pbVar34 + -0x2d),*(char **)pWVar25),
                         iVar12 == 0)) {
                        *(Table **)(pbVar34 + -0x1d) = pTVar14;
                        *pbVar34 = *pbVar34 | 0x20;
                        pTVar14->nTabRef = pTVar14->nTabRef + 1;
                        pbVar1 = (byte *)((long)&pSVar15->selFlags + 1);
                        *pbVar1 = *pbVar1 | 0x20;
                      }
                      lVar28 = lVar28 + 1;
                      pbVar34 = pbVar34 + 0x70;
                    } while (lVar28 < pSVar8->nSrc);
                  }
                  if (2 < pTVar14->nTabRef) {
                    sqlite3ErrorMsg(pParse_00,"multiple references to recursive table: %s",
                                    *(undefined8 *)pWVar25);
                    goto LAB_0023bff9;
                  }
                  pWVar25->a[0].pCols = (ExprList *)"circular reference: %s";
                  pWVar5 = pParse_00->pWith;
                  pParse_00->pWith = local_b8;
                  if (bVar10 < 2) {
                    pSVar31 = pSVar15->pPrior;
                    pSVar31->pWith = pSVar15->pWith;
                    sqlite3WalkSelect(pWalker,pSVar31);
                    pSVar31->pWith = (With *)0x0;
                    local_60 = pWVar5;
                  }
                  else {
                    sqlite3WalkSelect(pWalker,pSVar15);
                  }
                  pParse_00->pWith = local_b8;
                  pSVar31 = pSVar15;
                  do {
                    pSVar26 = pSVar31;
                    pSVar31 = pSVar26->pPrior;
                  } while (pSVar31 != (Select *)0x0);
                  pWVar6 = (With *)pSVar26->pEList;
                  pWVar7 = pWVar25->pOuter;
                  pWVar36 = pWVar6;
                  if (((pWVar7 == (With *)0x0) || (pWVar36 = pWVar7, pWVar6 == (With *)0x0)) ||
                     (pWVar6->nCte == pWVar7->nCte)) {
                    sqlite3ColumnsFromExprList
                              (pParse_00,(ExprList *)pWVar36,&pTVar14->nCol,&pTVar14->aCol);
                    if (bVar10 < 2) {
                      pcVar30 = "multiple recursive references: %s";
                      if ((pSVar15->selFlags >> 0xd & 1) == 0) {
                        pcVar30 = "recursive reference in a subquery: %s";
                      }
                      pWVar25->a[0].pCols = (ExprList *)pcVar30;
                      sqlite3WalkSelect(pWalker,pSVar15);
                    }
                    pWVar25->a[0].pCols = (ExprList *)0x0;
                    pParse_00->pWith = pWVar5;
                    goto LAB_0023bf85;
                  }
                  sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                  *(undefined8 *)pWVar25);
                  pParse_00->pWith = pWVar5;
                }
              }
            }
            else {
              sqlite3ErrorMsg(pParse_00,"\'%s\' is not a function",pSVar27->zName);
LAB_0023bff9:
              uVar23 = 1;
            }
          }
          else {
            sqlite3ErrorMsg(pParse_00,(char *)zFormat,*(undefined8 *)pWVar25);
            uVar23 = 1;
          }
        }
      }
LAB_0023bffd:
      if ((uVar23 & 0xfffffffb) != 0) {
        return 2;
      }
      iVar11 = iVar11 + 1;
      pSVar27 = pSVar27 + 1;
    } while (iVar11 < pList->nSrc);
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSVar8 = p->pSrc;
  if (1 < pSVar8->nSrc) {
    pSVar27 = pSVar8->a;
    pSVar38 = pSVar8 + 1;
    ppWhere = &p->pWhere;
    ppTVar16 = &pSVar8->a[0].pTab;
    lVar28 = 0;
    do {
      pTVar14 = (Table *)pSVar38->a[0].zAlias;
      bVar40 = false;
      if (pTVar14 != (Table *)0x0 && pSVar27->pTab != (Table *)0x0) {
        bVar10 = (byte)pSVar38->a[0].regReturn;
        uVar23 = (bVar10 & 0x20) >> 5;
        if ((bVar10 & 4) != 0) {
          lVar35._0_1_ = pSVar38->a[0].iSelectId;
          lVar35._1_3_ = *(undefined3 *)&pSVar38->a[0].field_0x41;
          lVar35._4_4_ = pSVar38->a[0].iCursor;
          if ((lVar35 != 0) || (pSVar38->a[0].pOn != (Expr *)0x0)) {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            bVar40 = true;
            goto LAB_0023c3e3;
          }
          if (0 < pTVar14->nCol) {
            lVar35 = 0;
            do {
              pcVar30 = pTVar14->aCol[lVar35].zName;
              uVar17 = 0;
              ppTVar33 = ppTVar16;
              do {
                uVar13 = columnIndex(*ppTVar33,pcVar30);
                if (-1 < (int)uVar13) {
                  local_88 = (char *)(uVar17 & 0xffffffff);
                  local_60 = (With *)(ulong)uVar13;
                  break;
                }
                uVar17 = uVar17 + 1;
                ppTVar33 = ppTVar33 + 0xe;
              } while (lVar28 + 1U != uVar17);
              if (-1 < (int)uVar13) {
                addWhereTerm(pParse,pSVar8,(int)local_88,(int)local_60,(int)lVar28 + 1,(int)lVar35,
                             uVar23,ppWhere);
              }
              lVar35 = lVar35 + 1;
            } while (lVar35 < pTVar14->nCol);
          }
        }
        pEVar19 = *(Expr **)&pSVar38->a[0].iSelectId;
        if (pEVar19 != (Expr *)0x0) {
          if (pSVar38->a[0].pOn != (Expr *)0x0) {
            sqlite3ErrorMsg(pParse,"cannot have both ON and USING clauses in the same join");
            bVar40 = true;
            goto LAB_0023c3e3;
          }
          if ((bVar10 & 0x20) != 0) {
            setJoinExpr(pEVar19,(int)pSVar38->a[0].fg);
          }
          pEVar19 = sqlite3ExprAnd(pParse->db,*ppWhere,*(Expr **)&pSVar38->a[0].iSelectId);
          *ppWhere = pEVar19;
          pSVar38->a[0].iSelectId = '\0';
          *(undefined3 *)&pSVar38->a[0].field_0x41 = 0;
          pSVar38->a[0].iCursor = 0;
        }
        pEVar19 = pSVar38->a[0].pOn;
        bVar40 = false;
        if ((pEVar19 != (Expr *)0x0) && (0 < (pEVar19->u).iValue)) {
          lVar35 = 0;
          do {
            pcVar30 = *(char **)(*(long *)pEVar19 + lVar35 * 0x10);
            iVar11 = columnIndex(pTVar14,pcVar30);
            if (iVar11 < 0) {
LAB_0023c3ae:
              sqlite3ErrorMsg(pParse,
                              "cannot join using column %s - column not present in both tables",
                              pcVar30);
              bVar40 = true;
              goto LAB_0023c3e3;
            }
            lVar32 = 0;
            ppTVar33 = ppTVar16;
            do {
              uVar13 = columnIndex(*ppTVar33,pcVar30);
              if (-1 < (int)uVar13) {
                iLeft = (uint)lVar32;
                iColLeft = uVar13;
                goto LAB_0023c341;
              }
              lVar32 = lVar32 + 1;
              ppTVar33 = ppTVar33 + 0xe;
            } while (lVar28 + 1 != lVar32);
            iColLeft = (uint)local_c8;
            iLeft = (uint)local_98;
LAB_0023c341:
            local_c8 = (Parse *)(ulong)iColLeft;
            local_98 = (sqlite3 *)(ulong)iLeft;
            if ((int)uVar13 < 0) goto LAB_0023c3ae;
            addWhereTerm(pParse,pSVar8,iLeft,iColLeft,(int)lVar28 + 1,iVar11,uVar23,ppWhere);
            lVar35 = lVar35 + 1;
          } while (lVar35 < (pEVar19->u).iValue);
          bVar40 = false;
        }
      }
LAB_0023c3e3:
      if (bVar40) {
        return 2;
      }
      lVar28 = lVar28 + 1;
      pSVar38 = (SrcList *)&pSVar38->a[0].pIBIndex;
      pSVar27 = pSVar27 + 1;
    } while (lVar28 < (long)pSVar8->nSrc + -1);
  }
  uVar17 = (ulong)pList_00->nExpr;
  bVar40 = 0 < (long)uVar17;
  if (0 < (long)uVar17) {
    pEVar29 = pList_00->a;
    uVar18 = 1;
    do {
      uVar3 = pEVar29->pExpr->op;
      if (uVar3 == 'z') {
        uVar3 = pEVar29->pExpr->pRight->op;
      }
      if (uVar3 == 0xa1) {
        if (bVar40) {
          if (0 < pList_00->nExpr) {
            local_98._0_4_ = pParse->db->flags & 0x44;
            lVar28 = 0;
            local_b8 = (With *)0x0;
            goto LAB_0023c572;
          }
          local_b8 = (With *)0x0;
          goto LAB_0023ca61;
        }
        break;
      }
      bVar40 = uVar18 < uVar17;
      pEVar29 = pEVar29 + 1;
      bVar39 = uVar18 != uVar17;
      uVar18 = uVar18 + 1;
    } while (bVar39);
  }
  goto LAB_0023ca7c;
LAB_0023c572:
  do {
    pEVar19 = pList_00->a[lVar28].pExpr;
    if (pEVar19->op == 0xa1) {
      local_88 = (char *)0x0;
LAB_0023c606:
      if (pList->nSrc < 1) {
        bVar40 = true;
      }
      else {
        local_80 = 0;
        local_e8 = -0x70;
        bVar40 = false;
        pSVar27 = pList->a;
        do {
          local_c8 = (Parse *)pSVar27->zAlias;
          pTVar14 = pSVar27->pTab;
          if (local_c8 == (Parse *)0x0) {
            local_c8 = (Parse *)pTVar14->zName;
          }
          uVar3 = db->mallocFailed;
          if (uVar3 == '\0') {
            pSVar15 = pSVar27->pSelect;
            if ((pSVar15 == (Select *)0x0) || ((pSVar15->selFlags & 0x800) == 0)) {
              if ((local_88 != (char *)0x0) &&
                 (iVar11 = sqlite3StrICmp(local_88,(char *)local_c8), iVar11 != 0))
              goto LAB_0023c9c4;
              if (pTVar14->pSchema == (Schema *)0x0) {
                uVar17 = 0xfff0bdc0;
              }
              else {
                uVar23 = db->nDb;
                if ((int)uVar23 < 1) {
                  uVar17 = 0;
                }
                else {
                  ppSVar37 = &db->aDb->pSchema;
                  uVar18 = 0;
                  do {
                    uVar17 = uVar18;
                    if (*ppSVar37 == pTVar14->pSchema) break;
                    uVar18 = uVar18 + 1;
                    ppSVar37 = ppSVar37 + 4;
                    uVar17 = (ulong)uVar23;
                  } while (uVar23 != uVar18);
                }
              }
              if ((int)uVar17 < 0) {
                pSVar15 = (Select *)0x0;
                pcVar30 = "*";
              }
              else {
                pcVar30 = db->aDb[uVar17 & 0xffffffff].zDbSName;
                pSVar15 = (Select *)0x0;
              }
            }
            else {
              pcVar30 = (char *)0x0;
            }
            if (0 < pTVar14->nCol) {
              lVar35 = 0;
              do {
                pCVar9 = pTVar14->aCol;
                pcVar22 = pCVar9[lVar35].zName;
                if (((pSVar15 == (Select *)0x0 || local_88 == (char *)0x0) ||
                    (iVar11 = sqlite3MatchSpanName
                                        (pSVar15->pEList->a[lVar35].zSpan,(char *)0x0,local_88,
                                         (char *)0x0), iVar11 != 0)) &&
                   (((p->selFlags & 0x20000) != 0 || ((pCVar9[lVar35].colFlags & 2) == 0)))) {
                  if (local_80 != 0 && local_88 == (char *)0x0) {
                    if (((pSVar27->fg).jointype & 4) != 0) {
                      lVar32 = 0;
                      do {
                        iVar11 = columnIndex(*(Table **)((long)&pList->a[0].pTab + lVar32),pcVar22);
                        if (-1 < iVar11) break;
                        bVar40 = local_e8 != lVar32;
                        lVar32 = lVar32 + 0x70;
                      } while (bVar40);
                      bVar40 = true;
                      if (-1 < iVar11) goto LAB_0023c9ae;
                    }
                    iVar11 = sqlite3IdListIndex(pSVar27->pUsing,pcVar22);
                    bVar40 = true;
                    if (-1 < iVar11) goto LAB_0023c9ae;
                  }
                  pEVar19 = sqlite3Expr(db,0x1b,pcVar22);
                  if (((uint)local_98 == 4) || (1 < pList->nSrc)) {
                    pEVar20 = sqlite3Expr(db,0x1b,(char *)local_c8);
                    pEVar19 = sqlite3PExpr(pParse,0x7a,pEVar20,pEVar19);
                    if (pcVar30 != (char *)0x0) {
                      sColname.z = pcVar30;
                      sVar21 = strlen(pcVar30);
                      sColname.n = (uint)sVar21 & 0x3fffffff;
                      pEVar20 = sqlite3ExprAlloc(db,0x1b,&sColname,0);
                      pEVar19 = sqlite3PExpr(pParse,0x7a,pEVar20,pEVar19);
                    }
                    if ((uint)local_98 != 4) goto LAB_0023c8d9;
                    p_00 = sqlite3MPrintf(db,"%s.%s",local_c8);
                    pcVar22 = p_00;
                  }
                  else {
LAB_0023c8d9:
                    p_00 = (char *)0x0;
                  }
                  local_b8 = (With *)sqlite3ExprListAppend(pParse,(ExprList *)local_b8,pEVar19);
                  sColname.z = pcVar22;
                  if (pcVar22 == (char *)0x0) {
                    sColname.n = 0;
                  }
                  else {
                    sVar21 = strlen(pcVar22);
                    sColname.n = (uint)sVar21 & 0x3fffffff;
                  }
                  sqlite3ExprListSetName(pParse,(ExprList *)local_b8,&sColname,0);
                  if ((local_b8 != (With *)0x0) && ((p->selFlags & 0x800) != 0)) {
                    iVar11 = ((ExprList *)local_b8)->nExpr;
                    if (pSVar15 == (Select *)0x0) {
                      pcVar22 = sqlite3MPrintf(db,"%s.%s.%s",pcVar30,local_c8,pcVar22);
                    }
                    else {
                      pcVar22 = sqlite3DbStrDup(db,pSVar15->pEList->a[lVar35].zSpan);
                    }
                    ((ExprList *)local_b8)->a[(long)iVar11 + -1].zSpan = pcVar22;
                    puVar2 = &((ExprList *)local_b8)->a[(long)iVar11 + -1].field_0x19;
                    *puVar2 = *puVar2 | 2;
                  }
                  bVar40 = true;
                  if (p_00 != (char *)0x0) {
                    sqlite3DbFreeNN(db,p_00);
                  }
                }
LAB_0023c9ae:
                lVar35 = lVar35 + 1;
              } while (lVar35 < pTVar14->nCol);
            }
          }
LAB_0023c9c4:
          if (uVar3 != '\0') break;
          local_80 = local_80 + 1;
          pSVar27 = pSVar27 + 1;
          local_e8 = local_e8 + 0x70;
        } while (local_80 < pList->nSrc);
        bVar40 = !bVar40;
      }
      if (bVar40) {
        if (local_88 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"no tables specified");
        }
        else {
          sqlite3ErrorMsg(pParse,"no such table: %s");
        }
      }
    }
    else {
      if ((pEVar19->op == 'z') && (pEVar19->pRight->op == 0xa1)) {
        local_88 = (pEVar19->pLeft->u).zToken;
        goto LAB_0023c606;
      }
      pEVar29 = pList_00->a + lVar28;
      local_b8 = (With *)sqlite3ExprListAppend(pParse,(ExprList *)local_b8,pEVar19);
      if (local_b8 != (With *)0x0) {
        iVar11 = ((ExprList *)local_b8)->nExpr;
        ((ExprList *)local_b8)->a[(long)iVar11 + -1].zName = pEVar29->zName;
        ((ExprList *)local_b8)->a[(long)iVar11 + -1].zSpan = pEVar29->zSpan;
        pEVar29->zName = (char *)0x0;
        pEVar29->zSpan = (char *)0x0;
      }
      pEVar29->pExpr = (Expr *)0x0;
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 < pList_00->nExpr);
LAB_0023ca61:
  exprListDeleteNN(db,pList_00);
  p->pEList = (ExprList *)local_b8;
LAB_0023ca7c:
  if (p->pEList == (ExprList *)0x0) {
    return 0;
  }
  if (db->aLimit[2] < p->pEList->nExpr) {
    sqlite3ErrorMsg(pParse,"too many columns in result set");
    return 2;
  }
  return 0;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( p->pWith ){
    sqlite3WithPush(pParse, p->pWith, 0);
  }

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nTabRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_sq_%p", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      sqlite3ColumnsFromExprList(pParse, pSel->pEList,&pTab->nCol,&pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3SelectSetName(pFrom->pSelect, pTab->zName);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
    return WRC_Abort;
  }
#endif
  return WRC_Continue;
}